

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O0

SharedPtr<vkt::Draw::Buffer> __thiscall
vkt::Draw::anon_unknown_1::
createAndUploadBuffer<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>
          (anon_unknown_1 *this,
          vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
          *data,DeviceInterface *vk,Context *context)

{
  Context *pCVar1;
  size_type sVar2;
  VkDevice pVVar3;
  Allocator *allocator;
  Buffer *pBVar4;
  void *dst;
  const_reference src;
  VkDeviceSize offset;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Buffer> SVar5;
  Allocation local_108;
  Allocation local_e8;
  VkDeviceMemory local_c8;
  Allocation local_c0;
  void *local_a0;
  deUint8 *ptr;
  BufferCreateInfo local_88;
  undefined1 local_31;
  VkDeviceSize local_30;
  VkDeviceSize dataSize;
  Context *context_local;
  DeviceInterface *vk_local;
  vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
  *data_local;
  SharedPtr<vkt::Draw::Buffer> *vertexBuffer;
  
  dataSize = (VkDeviceSize)context;
  context_local = (Context *)vk;
  vk_local = (DeviceInterface *)data;
  data_local = (vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
                *)this;
  sVar2 = std::
          vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
          ::size(data);
  pCVar1 = context_local;
  local_30 = sVar2 << 5;
  local_31 = 0;
  pVVar3 = Context::getDevice((Context *)dataSize);
  BufferCreateInfo::BufferCreateInfo
            (&local_88,local_30,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  allocator = Context::getDefaultAllocator((Context *)dataSize);
  ptr._0_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)this,(DeviceInterface *)pCVar1,pVVar3,&local_88.super_VkBufferCreateInfo,
             allocator,::vk::MemoryRequirement::HostVisible);
  BufferCreateInfo::~BufferCreateInfo(&local_88);
  pBVar4 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)this);
  Draw::Buffer::getBoundMemory(&local_c0,pBVar4);
  dst = ::vk::Allocation::getHostPtr(&local_c0);
  ::vk::Allocation::~Allocation(&local_c0);
  local_a0 = dst;
  src = std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::operator[](data,0);
  ::deMemcpy(dst,src,local_30);
  pCVar1 = context_local;
  pVVar3 = Context::getDevice((Context *)dataSize);
  pBVar4 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)this);
  Draw::Buffer::getBoundMemory(&local_e8,pBVar4);
  local_c8 = ::vk::Allocation::getMemory(&local_e8);
  pBVar4 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)this);
  Draw::Buffer::getBoundMemory(&local_108,pBVar4);
  offset = ::vk::Allocation::getOffset(&local_108);
  ::vk::flushMappedMemoryRange((DeviceInterface *)pCVar1,pVVar3,local_c8,offset,0xffffffffffffffff);
  ::vk::Allocation::~Allocation(&local_108);
  ::vk::Allocation::~Allocation(&local_e8);
  SVar5.m_state = extraout_RDX;
  SVar5.m_ptr = (Buffer *)this;
  return SVar5;
}

Assistant:

de::SharedPtr<Buffer> createAndUploadBuffer(const std::vector<T> data, const vk::DeviceInterface& vk, const Context& context)
{
	const vk::VkDeviceSize dataSize = data.size() * sizeof(T);
	de::SharedPtr<Buffer> vertexBuffer = Buffer::createAndAlloc(vk, context.getDevice(),
																BufferCreateInfo(dataSize, vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT),
																context.getDefaultAllocator(),
																vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(vertexBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &data[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(vk, context.getDevice(),
							   vertexBuffer->getBoundMemory().getMemory(),
							   vertexBuffer->getBoundMemory().getOffset(),
							   VK_WHOLE_SIZE);
	return vertexBuffer;
}